

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal-multiple-loops.c
# Opt level: O2

void loop_creating_worker(void *context)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  uv_signal_t signal;
  
  do {
    loop = (uv_loop_t *)malloc(0x350);
    if (loop == (uv_loop_t *)0x0) {
      pcVar3 = "loop != NULL";
      uVar2 = 0xad;
LAB_0014717a:
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-signal-multiple-loops.c"
              ,uVar2,pcVar3);
      abort();
    }
    iVar1 = uv_loop_init(loop);
    if (iVar1 != 0) {
      pcVar3 = "0 == uv_loop_init(loop)";
      uVar2 = 0xae;
      goto LAB_0014717a;
    }
    iVar1 = uv_signal_init(loop,&signal);
    if (iVar1 != 0) {
      pcVar3 = "r == 0";
      uVar2 = 0xb1;
      goto LAB_0014717a;
    }
    iVar1 = uv_signal_start(&signal,signal_unexpected_cb,0xf);
    if (iVar1 != 0) {
      pcVar3 = "r == 0";
      uVar2 = 0xb4;
      goto LAB_0014717a;
    }
    uv_close((uv_handle_t *)&signal,(uv_close_cb)0x0);
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) {
      pcVar3 = "r == 0";
      uVar2 = 0xb9;
      goto LAB_0014717a;
    }
    uv_loop_close(loop);
    free(loop);
    increment_counter(&loop_creation_counter);
    if (stop != 0) {
      return;
    }
  } while( true );
}

Assistant:

static void loop_creating_worker(void* context) {
  (void) context;

  do {
    uv_loop_t *loop;
    uv_signal_t signal;
    int r;

    loop = malloc(sizeof(*loop));
    ASSERT(loop != NULL);
    ASSERT(0 == uv_loop_init(loop));

    r = uv_signal_init(loop, &signal);
    ASSERT(r == 0);

    r = uv_signal_start(&signal, signal_unexpected_cb, SIGTERM);
    ASSERT(r == 0);

    uv_close((uv_handle_t*) &signal, NULL);

    r = uv_run(loop, UV_RUN_DEFAULT);
    ASSERT(r == 0);

    uv_loop_close(loop);
    free(loop);

    increment_counter(&loop_creation_counter);
  } while (!stop);
}